

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# new.cc
# Opt level: O2

void operator_delete__(void *p,size_t size,align_val_t val)

{
  PagemapEntry *entry;
  undefined1 *puVar1;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *this;
  long lVar2;
  code *pcVar3;
  ulong uVar4;
  ulong uVar5;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_> *pDVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  BackendSlabMetadata *meta;
  undefined8 *in_FS_OFFSET;
  ulong uStack_30;
  anon_class_8_1_8991fb9c local_28;
  
  pDVar6 = snmalloc::
           BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>
           ::concretePagemap.body;
  uVar4 = size - 1 | val - 1;
  uStack_30 = uVar4 + 1;
  if (((0xdfff < uVar4) && (uStack_30 == 0)) && (size != 0)) {
    uStack_30 = 0xffffffffffffffff;
  }
  uVar5 = (ulong)p >> 0xe;
  uVar4 = snmalloc::
          BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>
          ::concretePagemap.body[uVar5].
          super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
          .super_MetaEntryBase.remote_and_sizeclass;
  if ((undefined1 *)(uVar4 & 0xffffffffffffff80) == (undefined1 *)0x0) {
    if (p == (void *)0x0) {
      return;
    }
  }
  else {
    uVar9 = (uStack_30 - 1) + (ulong)(uStack_30 == 0);
    if (uStack_30 < 0xe001) {
      uVar10 = (ulong)(byte)(&snmalloc::sizeclass_lookup)[uVar9 >> 4] + 0x40;
    }
    else {
      uVar10 = 0x3f;
      if (uVar9 != 0) {
        for (; uVar9 >> uVar10 == 0; uVar10 = uVar10 - 1) {
        }
      }
      uVar10 = uVar10 ^ 0x3f;
    }
    uVar8 = (uint)uVar4 & 0x7f;
    if ((p == (void *)0x0) || (uVar10 == uVar8)) {
      entry = snmalloc::
              BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>
              ::concretePagemap.body + uVar5;
      this = (Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *)
             *in_FS_OFFSET;
      if (&this->remote_alloc ==
          (conditional_t<Config::Options_IsQueueInline,_RemoteAllocator,_RemoteAllocator_*> *)
          (uVar4 & 0xffffffffffffff80)) {
        if ((*(ulong *)(snmalloc::sizeclass_metadata + (ulong)(uVar8 << 5) + 8) & (ulong)p) *
            *(ulong *)(snmalloc::sizeclass_metadata + (ulong)(uVar8 << 5) + 0x18) <
            *(ulong *)(snmalloc::sizeclass_metadata + (ulong)(uVar8 << 5) + 0x18)) {
          uVar4 = (entry->
                  super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
                  ).super_MetaEntryBase.meta;
          meta = (BackendSlabMetadata *)(uVar4 & 0xfffffffffffffffe);
          snmalloc::freelist::
          Builder<true,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
          ::add(&(meta->
                 super_FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
                 ).free_queue,
                (BHeadPtr<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
                 )p,&snmalloc::freelist::Object::key_root,uVar4 >> 3,&this->entropy);
          puVar1 = &(meta->
                    super_FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
                    ).free_queue.field_0x24;
          *(short *)puVar1 = *(short *)puVar1 + -1;
          if (*(short *)puVar1 != 0) {
            return;
          }
          snmalloc::
          Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>::
          dealloc_local_object_slow(this,(Alloc<void>)p,entry,meta);
          return;
        }
      }
      else if (-1 < (char)uVar4) {
        lVar2 = (this->remote_dealloc_cache).capacity;
        lVar7 = lVar2 - *(long *)(snmalloc::sizeclass_metadata + (uVar8 << 5));
        if (lVar7 != 0 && *(long *)(snmalloc::sizeclass_metadata + (uVar8 << 5)) <= lVar2) {
          local_28.this = &this->remote_dealloc_cache;
          (this->remote_dealloc_cache).capacity = lVar7;
          if (p != (void *)0x0) {
            *(undefined8 *)p = 0;
            *(undefined8 *)((long)p + 8) = 0;
            pDVar6 = snmalloc::
                     BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>
                     ::concretePagemap.body;
          }
          uVar4 = pDVar6[uVar5].
                  super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
                  .super_MetaEntryBase.remote_and_sizeclass;
          if (p != (void *)0x0) {
            *(undefined8 *)p = 0;
            *(undefined8 *)((long)p + 8) = 0;
          }
          snmalloc::
          RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
          ::dealloc<11008UL>::anon_class_8_1_8991fb9c::operator()
                    (&local_28,uVar4 & 0xffffffffffffff80,(Alloc<RemoteMessage>)p);
          return;
        }
        snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
        ::dealloc_remote_slow<snmalloc::CheckInitPthread>(this,entry,(Alloc<void>)p);
        return;
      }
    }
  }
  pcVar3 = (code *)invalidInstructionException();
  (*pcVar3)();
}

Assistant:

void operator delete[](void* p, size_t size, std::align_val_t val) EXCEPTSPEC
{
  size = snmalloc::aligned_size(size_t(val), size);
  snmalloc::libc::free_sized(p, size);
}